

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::defaultListTests
               (ostream *out,ColourImpl *streamColour,
               vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
               bool isFiltered,Verbosity verbosity)

{
  bool bVar1;
  ColourGuard *rhs;
  pluralise *pluraliser;
  size_type size;
  ostream *poVar2;
  byte in_CL;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_RDX;
  ostream *in_RDI;
  int in_R8D;
  StringRef SVar3;
  ColourGuard colourGuard;
  Code colour;
  TestCaseInfo *testCaseInfo;
  TestCaseHandle *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  string *in_stack_fffffffffffffdb8;
  Column *in_stack_fffffffffffffdc0;
  pluralise *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_stack_fffffffffffffde8;
  ostream *in_stack_fffffffffffffdf0;
  TestCaseInfo *in_stack_fffffffffffffe48;
  Column *in_stack_fffffffffffffe78;
  ostream *in_stack_fffffffffffffe80;
  Column local_160;
  string local_120 [32];
  Column local_100;
  Column local_c0;
  ColourGuard local_60;
  undefined4 local_4c;
  TestCaseInfo *local_48;
  reference local_40;
  TestCaseHandle *local_38;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_30;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_28;
  int local_20;
  byte local_19;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *local_18;
  ostream *local_8;
  
  local_19 = in_CL & 1;
  if (in_R8D == 0) {
    anon_unknown_26::listTestNamesOnly(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  else {
    local_20 = in_R8D;
    local_18 = in_RDX;
    local_8 = in_RDI;
    if (local_19 == 0) {
      std::operator<<(in_RDI,"All available test cases:\n");
    }
    else {
      std::operator<<(in_RDI,"Matching test cases:\n");
    }
    local_28 = local_18;
    local_30._M_current =
         (TestCaseHandle *)
         std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                   ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                    in_stack_fffffffffffffdb8);
    local_38 = (TestCaseHandle *)
               std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                         ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                          in_stack_fffffffffffffdb8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                          *)in_stack_fffffffffffffdc0,
                         (__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                          *)in_stack_fffffffffffffdb8);
      if (!bVar1) break;
      local_40 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                 ::operator*(&local_30);
      local_48 = TestCaseHandle::getTestCaseInfo(local_40);
      bVar1 = TestCaseInfo::isHidden((TestCaseInfo *)0x19c109);
      local_4c = 0;
      if (bVar1) {
        local_4c = 0x17;
      }
      ColourImpl::guardColour
                ((ColourImpl *)in_stack_fffffffffffffdc8,
                 (Code)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      rhs = ColourImpl::ColourGuard::engage
                      ((ColourGuard *)in_stack_fffffffffffffdc0,(ostream *)in_stack_fffffffffffffdb8
                      );
      ColourImpl::ColourGuard::ColourGuard(&local_60,rhs);
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)in_stack_fffffffffffffdc0);
      TextFlow::Column::Column(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      TextFlow::Column::indent(&local_c0,2);
      poVar2 = TextFlow::operator<<(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::operator<<(poVar2,'\n');
      TextFlow::Column::~Column((Column *)0x19c1e8);
      if (1 < local_20) {
        Detail::stringify<Catch::SourceLineInfo>((SourceLineInfo *)in_stack_fffffffffffffdb8);
        TextFlow::Column::Column(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        TextFlow::Column::indent(&local_100,4);
        poVar2 = TextFlow::operator<<(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::operator<<(poVar2,'\n');
        TextFlow::Column::~Column((Column *)0x19c282);
        std::__cxx11::string::~string(local_120);
      }
      bVar1 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::empty
                        ((vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)
                         in_stack_fffffffffffffdd0);
      if ((!bVar1) && (0 < local_20)) {
        TestCaseInfo::tagsAsString_abi_cxx11_(in_stack_fffffffffffffe48);
        TextFlow::Column::Column(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        TextFlow::Column::indent(&local_160,6);
        poVar2 = TextFlow::operator<<(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        std::operator<<(poVar2,'\n');
        TextFlow::Column::~Column((Column *)0x19c3f1);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
      }
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)in_stack_fffffffffffffdc0);
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
      ::operator++(&local_30);
    }
    if ((local_19 & 1) == 0) {
      poVar2 = local_8;
      size = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                       (local_18);
      SVar3 = operator____sr((char *)poVar2,size);
      pluralise::pluralise((pluralise *)&stack0xfffffffffffffe40,size,SVar3);
      operator<<(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    }
    else {
      poVar2 = local_8;
      pluraliser = (pluralise *)
                   std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                             (local_18);
      SVar3 = operator____sr((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      pluralise::pluralise((pluralise *)&stack0xfffffffffffffe68,(uint64_t)pluraliser,SVar3);
      operator<<(poVar2,pluraliser);
    }
    poVar2 = std::operator<<(local_8,"\n\n");
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void defaultListTests(std::ostream& out, ColourImpl* streamColour, std::vector<TestCaseHandle> const& tests, bool isFiltered, Verbosity verbosity) {
        // We special case this to provide the equivalent of old
        // `--list-test-names-only`, which could then be used by the
        // `--input-file` option.
        if (verbosity == Verbosity::Quiet) {
            listTestNamesOnly(out, tests);
            return;
        }

        if (isFiltered) {
            out << "Matching test cases:\n";
        } else {
            out << "All available test cases:\n";
        }

        for (auto const& test : tests) {
            auto const& testCaseInfo = test.getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            auto colourGuard = streamColour->guardColour( colour ).engage( out );

            out << TextFlow::Column(testCaseInfo.name).indent(2) << '\n';
            if (verbosity >= Verbosity::High) {
                out << TextFlow::Column(Catch::Detail::stringify(testCaseInfo.lineInfo)).indent(4) << '\n';
            }
            if (!testCaseInfo.tags.empty() &&
                verbosity > Verbosity::Quiet) {
                out << TextFlow::Column(testCaseInfo.tagsAsString()).indent(6) << '\n';
            }
        }

        if (isFiltered) {
            out << pluralise(tests.size(), "matching test case"_sr);
        } else {
            out << pluralise(tests.size(), "test case"_sr);
        }
        out << "\n\n" << std::flush;
    }